

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splayTest.cpp
# Opt level: O1

void testConfigurationCorrectness(int dataCount,int minimumN)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  bool spin;
  int iVar8;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  vector<double,_std::allocator<double>_> aF;
  vector<double,_std::allocator<double>_> aL;
  vector<double,_std::allocator<double>_> aJ;
  SplayWeightConfiguration c;
  double local_1a0;
  double local_198;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  vector<double,_std::allocator<double>_> local_148;
  SplayWeightConfiguration local_130;
  
  randomVector(&local_148,mJ + 1);
  randomVector(&local_160,mL + 1);
  randomVector(&local_178,mF + 1);
  SplayWeightConfiguration::SplayWeightConfiguration(&local_130,&local_148,&local_160,&local_178);
  std::chrono::_V2::system_clock::now();
  if (dataCount < 1) {
    local_1a0 = 0.0;
  }
  else {
    local_1a0 = 0.0;
    iVar8 = dataCount;
    do {
      uVar4 = rand();
      iVar6 = local_130.n;
      if ((uVar4 & 1) == 0) {
        if (minimumN < local_130.n) {
          iVar5 = rand();
          iVar5 = iVar5 % iVar6;
          dVar1 = SplayWeightConfiguration::removeDeltaWeightJL
                            (&local_130,
                             local_130.c.
                             super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar5].first,
                             local_130.c.
                             super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar5].second);
          dVar2 = SplayWeightConfiguration::deltaF(&local_130,local_130.n + -1);
          local_130.weightJL = dVar1 + local_130.weightJL;
          local_130.weightF = local_130.weightF - dVar2;
          SplayWeightConfiguration::removeSpin(&local_130,iVar5);
        }
      }
      else {
        iVar6 = rand();
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        spin = (bool)((byte)iVar6 & 1);
        dVar1 = dVar1 * (random_double._M_param._M_b - random_double._M_param._M_a) +
                random_double._M_param._M_a + -0.5;
        dVar1 = dVar1 + dVar1;
        dVar2 = SplayWeightConfiguration::insertDeltaWeightJL(&local_130,spin,dVar1);
        dVar3 = SplayWeightConfiguration::deltaF(&local_130,local_130.n);
        SplayWeightConfiguration::insertSpin(&local_130,spin,dVar1);
        local_130.weightJL = dVar2 + local_130.weightJL;
        local_130.weightF = dVar3 + local_130.weightF;
      }
      if (local_130.n == 0) {
        local_198 = local_130.weightF;
      }
      else {
        local_198 = local_130.weightJL / (double)local_130.n + local_130.weightF;
      }
      dVar1 = SplayWeightConfiguration::bruteForceMBH(&local_130);
      local_1a0 = local_1a0 + ABS((local_198 - dVar1) / dVar1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"average error for m^2 configuration = ",0x26);
  poVar7 = std::ostream::_M_insert<double>(local_1a0 / (double)dataCount);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  SplayWeightConfiguration::~SplayWeightConfiguration(&local_130);
  if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testConfigurationCorrectness(int dataCount = 10000, int minimumN = 30) {
    // run a test of dataCount steps, n cannot be decreased if lower than minimumN
    // test the correctness by comparing with O(n^2) weight calculation
    vector<double> aJ = randomVector(mJ + 1);
    vector<double> aL = randomVector(mL + 1);
    vector<double> aF = randomVector(mF + 1);
    bool efficiencyTest = false;
    SplayWeightConfiguration c(aJ, aL, aF);
    double dWeightJL, dWeightF;
    double totalError = 0.0;
    // int dataCount = 10000;
    double averageN = 0;

    auto millisecBeforeSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    for (int i = 0; i < dataCount; ++i) {
        bool isInsert = randomInt(2);
        if (isInsert) {
            bool spin = randomInt(2);
            double tau = generateDataPoint();
            dWeightJL = c.insertDeltaWeightJL(spin, tau);
            dWeightF = c.insertDeltaWeightF();
            c.insertSpin(spin, tau);
            c.updateWeight(dWeightJL, dWeightF);
        } else if (c.n > minimumN) {
            int idx = randomInt(c.n);
            dWeightJL = c.removeDeltaWeightJL(c.c[idx].first, c.c[idx].second);
            dWeightF = c.removeDeltaWeightF();
            c.updateWeight(dWeightJL, dWeightF);
            c.removeSpin(idx);
        }
        if (!efficiencyTest) {
            double weight = c.getWeight(), mbhWeight = c.bruteForceMBH();
            totalError += fabs((weight - mbhWeight) / mbhWeight);
        }

        averageN += c.n;
    }
    auto millisecAfterSimulation = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
    averageN /= dataCount;
    if (efficiencyTest) {
        cout << "Test the efficiency for a simulation of " << dataCount << " steps." << endl;
        cout << (millisecAfterSimulation - millisecBeforeSimulation) * 1000000.0 / dataCount << " milliseconds for 10^6 steps, with average n = " << averageN << ", (mL, mJ, mF) = (" << mL << ", " << mJ << ", " << mF << ")." << endl;
    }
    if (!efficiencyTest) {
        double averageError = totalError / dataCount;
        cout << "average error for m^2 configuration = " << averageError << endl;
    }
    // c.printA();
}